

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O1

void __thiscall
Renderer::Render(Renderer *this,vector<Obstacle,_std::allocator<Obstacle>_> *obst,
                vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_> *carObjects)

{
  pointer pOVar1;
  pointer psVar2;
  Car *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  Obstacle *m;
  pointer this_02;
  pointer psVar3;
  SDL_Rect block;
  SDL_Rect texRect;
  int local_50;
  int local_4c;
  undefined8 local_48;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  local_48 = CONCAT44((int)(this->screen_height / this->grid_height),
                      (int)(this->screen_width / this->grid_width));
  SDL_SetRenderDrawColor(this->sdl_renderer,0x1e,0x1e,0x1e,0xff);
  SDL_RenderClear(this->sdl_renderer);
  local_40 = 0;
  uStack_3c = 0;
  uStack_38 = 0x32;
  uStack_34 = 0x32;
  SDL_RenderCopy(this->sdl_renderer,this->tex,0);
  SDL_RenderPresent(this->sdl_renderer);
  if (this->endbmp == (SDL_Surface *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"error rendering the flag",0x18);
  }
  SDL_SetRenderDrawColor(this->sdl_renderer,0xcc,0xff,0xcc,0xff);
  this_02 = (obst->super__Vector_base<Obstacle,_std::allocator<Obstacle>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pOVar1 = (obst->super__Vector_base<Obstacle,_std::allocator<Obstacle>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (this_02 != pOVar1) {
    do {
      local_50 = Obstacle::get_xpos(this_02);
      local_4c = Obstacle::get_ypos(this_02);
      SDL_RenderFillRect(this->sdl_renderer,&local_50);
      this_02 = this_02 + 1;
    } while (this_02 != pOVar1);
  }
  psVar3 = (carObjects->
           super__Vector_base<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>)._M_impl
           .super__Vector_impl_data._M_start;
  psVar2 = (carObjects->
           super__Vector_base<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  if (psVar3 != psVar2) {
    do {
      this_00 = (psVar3->super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this_01 = (psVar3->super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      local_50 = Car::get_xpos(this_00);
      local_4c = Car::get_ypos(this_00);
      local_48 = 0x2800000028;
      SDL_RenderCopy(this->sdl_renderer,this->texCar,0,&local_50);
      SDL_RenderPresent(this->sdl_renderer);
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      psVar3 = psVar3 + 1;
    } while (psVar3 != psVar2);
  }
  SDL_RenderPresent(this->sdl_renderer);
  return;
}

Assistant:

void Renderer::Render( std::vector<Obstacle>& obst, std::vector<std::shared_ptr<Car>> carObjects) {
  SDL_Rect block;
  block.w = screen_width / grid_width;
  block.h = screen_height / grid_height;

  // Clear screen
  SDL_SetRenderDrawColor(sdl_renderer, 0x1E, 0x1E, 0x1E, 0xFF);
  SDL_RenderClear(sdl_renderer);

  SDL_Rect texRect;// hold the flag image
  texRect.x = 0;
  texRect.y = 0;
  texRect.w = 50;
  texRect.h = 50;

  //render the flag
  SDL_RenderCopy(sdl_renderer,tex,NULL, &texRect);
  SDL_RenderPresent(sdl_renderer);
  if(endbmp == NULL)std::cout<<"error rendering the flag";

 


  //render obstacles
  SDL_SetRenderDrawColor(sdl_renderer, 0xCC, 0xFF, 0xCC, 0xFF);
  for ( auto& m : obst){
    //std::cout << m <<std::endl;
    block.x = m.get_xpos();
    block.y = m.get_ypos();
    SDL_RenderFillRect(sdl_renderer, &block);
  }


  //render cars
  //SDL_SetRenderDrawColor(sdl_renderer, 0x99, 0x00, 0xFF, 0xFF);
  for ( auto c : carObjects){
    //std::cout << "car location =" <<c->get_xpos();
    block.x = c->get_xpos();
    block.y = c->get_ypos();
    //SDL_RenderFillRect(sdl_renderer, &block);

    block.h = 40;
    block.w = 40;
    SDL_RenderCopy(sdl_renderer,texCar,NULL, &block);
    SDL_RenderPresent(sdl_renderer);

  }


  // Update Screen
  SDL_RenderPresent(sdl_renderer);
}